

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O2

void __thiscall PrintC::push_float(PrintC *this,uintb val,int4 sz,Varnode *vn,PcodeOp *op)

{
  uint *puVar1;
  bool bVar2;
  FloatFormat *this_00;
  uint uVar3;
  char *pcVar4;
  double dVar5;
  string local_1f0;
  floatclass type;
  undefined8 local_1c8;
  PcodeOp *local_1c0;
  anon_union_8_3_83778309_for_ptr_second local_1b8;
  ostringstream t;
  undefined8 local_1a0 [2];
  uint auStack_190 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&t);
  this_00 = Translate::getFloatFormat(((this->super_PrintLanguage).glb)->translate,sz);
  if (this_00 == (FloatFormat *)0x0) {
    std::operator<<((ostream *)&t,"FLOAT_UNKNOWN");
  }
  else {
    dVar5 = FloatFormat::getHostFloat(this_00,val,&type);
    if (type == nan) {
      bVar2 = FloatFormat::extractSign(this_00,val);
      pcVar4 = "NAN";
      if (bVar2) {
        std::operator<<((ostream *)&t,'-');
      }
    }
    else {
      if (type != infinity) {
        uVar3 = 0x100;
        if (((this->super_PrintLanguage).mods & 8) == 0) {
          uVar3 = 4;
        }
        puVar1 = (uint *)((long)auStack_190 + *(long *)(_t + -0x18));
        *puVar1 = *puVar1 | uVar3;
        *(undefined8 *)((long)local_1a0 + *(long *)(_t + -0x18)) = 8;
        std::ostream::_M_insert<double>(dVar5);
        goto LAB_00328544;
      }
      bVar2 = FloatFormat::extractSign(this_00,val);
      pcVar4 = "INFINITY";
      if (bVar2) {
        std::operator<<((ostream *)&t,'-');
      }
    }
    std::operator<<((ostream *)&t,pcVar4);
  }
LAB_00328544:
  local_1c0 = op;
  if (vn == (Varnode *)0x0) {
    std::__cxx11::stringbuf::str();
    local_1c8._0_4_ = syntax;
    local_1c8._4_4_ = const_color;
    _type = &local_1f0;
    PrintLanguage::pushAtom(&this->super_PrintLanguage,(Atom *)&type);
  }
  else {
    std::__cxx11::stringbuf::str();
    local_1c8._0_4_ = vartoken;
    local_1c8._4_4_ = const_color;
    _type = &local_1f0;
    local_1b8.vn = vn;
    PrintLanguage::pushAtom(&this->super_PrintLanguage,(Atom *)&type);
  }
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&t);
  return;
}

Assistant:

void PrintC::push_float(uintb val,int4 sz,const Varnode *vn,const PcodeOp *op)
{
  ostringstream t;

  const FloatFormat *format = glb->translate->getFloatFormat(sz);
  if (format == (const FloatFormat *)0) {
    t << "FLOAT_UNKNOWN";
  }
  else {
    FloatFormat::floatclass type;
    double floatval = format->getHostFloat(val,&type);
    if (type == FloatFormat::infinity) {
      if (format->extractSign(val))
	t << '-';
      t << "INFINITY";
    }
    else if (type == FloatFormat::nan) {
      if (format->extractSign(val))
	t << '-';
      t << "NAN";
    }
    else {
      if ((mods & force_scinote)!=0)
	t.setf( ios::scientific ); // Set to scientific notation
      else
	t.setf( ios::fixed );	// Otherwise use fixed notation
      t.precision(8);		// Number of digits of precision
      t << floatval;
    }
  }
  if (vn==(const Varnode *)0)
    pushAtom(Atom(t.str(),syntax,EmitXml::const_color,op));
  else
    pushAtom(Atom(t.str(),vartoken,EmitXml::const_color,op,vn));
}